

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pnm_test(stbi__context *s)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  char t;
  char p;
  stbi__context *s_local;
  
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if ((sVar1 == 'P') && ((sVar2 == '5' || (sVar2 == '6')))) {
    s_local._4_4_ = 1;
  }
  else {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int      stbi__pnm_test(stbi__context *s)
{
   char p, t;
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}